

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void ARGBAffineRow_C(uint8_t *src_argb,int src_argb_stride,uint8_t *dst_argb,float *uv_dudv,
                    int width)

{
  undefined8 uVar1;
  long lVar2;
  float fVar4;
  undefined8 uVar3;
  
  if (0 < width) {
    uVar3 = *(undefined8 *)uv_dudv;
    uVar1 = *(undefined8 *)(uv_dudv + 2);
    lVar2 = 0;
    do {
      fVar4 = (float)((ulong)uVar3 >> 0x20);
      *(undefined4 *)(dst_argb + lVar2 * 4) =
           *(undefined4 *)
            (src_argb + (long)(int)(float)uVar3 * 4 + (long)((int)fVar4 * src_argb_stride));
      uVar3 = CONCAT44(fVar4 + (float)((ulong)uVar1 >> 0x20),(float)uVar3 + (float)uVar1);
      lVar2 = lVar2 + 1;
    } while (width != (int)lVar2);
  }
  return;
}

Assistant:

LIBYUV_API
void ARGBAffineRow_C(const uint8_t* src_argb,
                     int src_argb_stride,
                     uint8_t* dst_argb,
                     const float* uv_dudv,
                     int width) {
  int i;
  // Render a row of pixels from source into a buffer.
  float uv[2];
  uv[0] = uv_dudv[0];
  uv[1] = uv_dudv[1];
  for (i = 0; i < width; ++i) {
    int x = (int)(uv[0]);
    int y = (int)(uv[1]);
    *(uint32_t*)(dst_argb) =
        *(const uint32_t*)(src_argb + y * src_argb_stride + x * 4);
    dst_argb += 4;
    uv[0] += uv_dudv[2];
    uv[1] += uv_dudv[3];
  }
}